

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

double Gudhi::Persistence_representations::compute_distance_of_landscapes
                 (Persistence_landscape *first,Persistence_landscape *second,double p)

{
  ostream *poVar1;
  double dVar2;
  double local_98;
  double result;
  Persistence_landscape local_80;
  undefined1 local_58 [8];
  Persistence_landscape lan;
  bool dbg;
  double p_local;
  Persistence_landscape *second_local;
  Persistence_landscape *first_local;
  
  lan.number_of_functions_for_projections_to_reals._7_1_ = 0;
  operator-((Persistence_landscape *)local_58,first,second);
  Persistence_landscape::abs(&local_80,(int)(Persistence_landscape *)local_58);
  Persistence_landscape::operator=((Persistence_landscape *)local_58,&local_80);
  Persistence_landscape::~Persistence_landscape(&local_80);
  if ((lan.number_of_functions_for_projections_to_reals._7_1_ & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::clog,"Abs of difference ; ");
    poVar1 = operator<<(poVar1,(Persistence_landscape *)local_58);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    getchar();
  }
  dVar2 = std::numeric_limits<double>::max();
  if (dVar2 <= p) {
    if ((lan.number_of_functions_for_projections_to_reals._7_1_ & 1) != 0) {
      std::operator<<((ostream *)&std::clog,"Power = infty, compute maximum \n");
    }
    first_local = (Persistence_landscape *)
                  Persistence_landscape::compute_maximum((Persistence_landscape *)local_58);
  }
  else {
    if ((p != 1.0) || (NAN(p))) {
      if ((lan.number_of_functions_for_projections_to_reals._7_1_ & 1) != 0) {
        std::operator<<((ostream *)&std::clog,"Power != 1, compute integral to the power p\n");
      }
      local_98 = Persistence_landscape::compute_integral_of_landscape
                           ((Persistence_landscape *)local_58,p);
    }
    else {
      if ((lan.number_of_functions_for_projections_to_reals._7_1_ & 1) != 0) {
        std::operator<<((ostream *)&std::clog,"Power = 1, compute integral \n");
      }
      local_98 = Persistence_landscape::compute_integral_of_landscape
                           ((Persistence_landscape *)local_58);
    }
    first_local = (Persistence_landscape *)pow(local_98,1.0 / p);
  }
  Persistence_landscape::~Persistence_landscape((Persistence_landscape *)local_58);
  return (double)first_local;
}

Assistant:

double compute_distance_of_landscapes(const Persistence_landscape& first, const Persistence_landscape& second,
                                      double p) {
  bool dbg = false;
  // This is what we want to compute: (\int_{- \infty}^{+\infty}| first-second |^p)^(1/p). We will do it one step at a
  // time:

  // first-second :
  Persistence_landscape lan = first - second;

  //| first-second |:
  lan = lan.abs();

  if (dbg) {
    std::clog << "Abs of difference ; " << lan << std::endl;
    getchar();
  }

  if (p < std::numeric_limits<double>::max()) {
    // \int_{- \infty}^{+\infty}| first-second |^p
    double result;
    if (p != 1) {
      if (dbg) std::clog << "Power != 1, compute integral to the power p\n";
      result = lan.compute_integral_of_landscape(p);
    } else {
      if (dbg) std::clog << "Power = 1, compute integral \n";
      result = lan.compute_integral_of_landscape();
    }
    // (\int_{- \infty}^{+\infty}| first-second |^p)^(1/p)
    return pow(result, 1.0 / p);
  } else {
    // p == infty
    if (dbg) std::clog << "Power = infty, compute maximum \n";
    return lan.compute_maximum();
  }
}